

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare::operator()
          (FileCompare *this,FileEntry *a,StringPiece b)

{
  bool bVar1;
  StringPiece x;
  FileEntry *a_local;
  FileCompare *this_local;
  StringPiece b_local;
  
  x = FileEntry::name(a,this->index);
  bVar1 = stringpiece_internal::operator<(x,b);
  return bVar1;
}

Assistant:

bool operator()(const FileEntry& a, StringPiece b) const {
      return a.name(index) < b;
    }